

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool quasiLexicographicalReverseLessThan(QFileInfo *fi1,QFileInfo *fi2)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = 0xaaaaaaaaaaaaaaaa;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFileInfo::baseName();
  local_68.size = 0xaaaaaaaaaaaaaaaa;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFileInfo::baseName();
  if (local_48.size == local_68.size) {
    bVar1 = operator>((QString *)&local_48,(QString *)&local_68);
  }
  else {
    bVar1 = (ulong)local_68.size < (ulong)local_48.size;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool quasiLexicographicalReverseLessThan(const QFileInfo &fi1, const QFileInfo &fi2)
{
    QString s1 = fi1.baseName();
    QString s2 = fi2.baseName();

    if (s1.size() == s2.size())
        return s1 > s2;
    else
        return s1.size() > s2.size();
}